

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_line.hpp
# Opt level: O2

void __thiscall Args::CmdLine::addArg(CmdLine *this,ArgIface *arg)

{
  unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *puVar1;
  __normal_iterator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_*,_std::vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>_>
  _Var2;
  BaseException *pBVar3;
  String local_a0;
  QString local_88;
  String local_70;
  QString local_58;
  String local_40;
  
  if (arg == (ArgIface *)0x0) {
    pBVar3 = (BaseException *)__cxa_allocate_exception(0x28);
    QString::QString(&local_88,"Attempt to add nullptr to the command line as argument.");
    BaseException::BaseException(pBVar3,(String *)&local_88);
    __cxa_throw(pBVar3,&BaseException::typeinfo,BaseException::~BaseException);
  }
  local_a0.m_str.d.d._0_1_ = '\0';
  local_a0.m_str.d.ptr = (char16_t *)arg;
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>*,std::vector<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,std::allocator<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>const>>
                    ((this->m_args).
                     super__Vector_base<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->m_args).
                     super__Vector_base<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  puVar1 = (this->m_args).
           super__Vector_base<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (((ArgIface *)local_a0.m_str.d.ptr != (ArgIface *)0x0) && ((char)local_a0.m_str.d.d == '\x01'))
  {
    (*(*(_func_int ***)local_a0.m_str.d.ptr)[1])();
  }
  if (_Var2._M_current == puVar1) {
    (*arg->_vptr_ArgIface[0x12])(arg,this);
    local_a0.m_str.d.d._0_1_ = '\0';
    local_a0.m_str.d.ptr = (char16_t *)arg;
    std::
    vector<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,std::allocator<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>>>
    ::emplace_back<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>>
              ((vector<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,std::allocator<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>>>
                *)&this->m_args,
               (unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)&local_a0);
    if (((ArgIface *)local_a0.m_str.d.ptr != (ArgIface *)0x0) &&
       ((char)local_a0.m_str.d.d == '\x01')) {
      (*(*(_func_int ***)local_a0.m_str.d.ptr)[1])();
    }
    return;
  }
  pBVar3 = (BaseException *)__cxa_allocate_exception(0x28);
  QString::QString(&local_58,"Argument \"");
  (*arg->_vptr_ArgIface[3])(&local_70,arg);
  operator+(&local_a0,(String *)&local_58,&local_70);
  operator+(&local_40,&local_a0,"\" already in the command line parser.");
  BaseException::BaseException(pBVar3,&local_40);
  __cxa_throw(pBVar3,&BaseException::typeinfo,BaseException::~BaseException);
}

Assistant:

inline void
CmdLine::addArg( ArgIface * arg )
{
	if( arg )
	{
		if( std::find( m_args.begin(), m_args.end(),
			ArgPtr( arg, details::Deleter< ArgIface > ( false ) ) ) ==
				m_args.end() )
		{
			arg->setCmdLine( this );

			m_args.push_back( ArgPtr( arg,
				details::Deleter< ArgIface > ( false ) ) );
		}
		else
			throw BaseException( String( SL( "Argument \"" ) ) +
				arg->name() + SL( "\" already in the command line parser." ) );
	}
	else
		throw BaseException( String( SL( "Attempt to add nullptr to the "
			"command line as argument." ) ) );
}